

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_b.c
# Opt level: O1

void test_option_b(void)

{
  char *__src;
  wchar_t wVar1;
  size_t sVar2;
  char *__dest;
  
  __src = testprog;
  sVar2 = strlen(testprog);
  __dest = (char *)malloc(sVar2 + 0x11);
  strcpy(__dest,__src);
  sVar2 = strlen(__dest);
  builtin_strncpy(__dest + sVar2," --format=ustar",0x10);
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_b.c"
                      ,L'$',"file1",L'Ƥ',L'\xffffffff',"file1");
  wVar1 = systemf("cat file1 > test_cat.out 2> test_cat.err");
  if (wVar1 != L'\0') {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_b.c"
                   ,L'&');
    test_skipping("Platform doesn\'t have cat");
    return;
  }
  wVar1 = systemf("%s -cf archive1.tar file1 >test1.out 2>test1.err",__dest);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_b.c"
                      ,L'-',0,"0",(long)wVar1,
                      "systemf(\"%s -cf archive1.tar file1 >test1.out 2>test1.err\", testprog_ustar)"
                      ,(void *)0x0);
  failure("bsdtar does not pad archives written directly to regular files");
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_b.c"
                      ,L'/',"archive1.tar",0x800);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_b.c"
             ,L'0',"test1.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_b.c"
             ,L'1',"test1.err");
  wVar1 = systemf("%s -cf - file1 2>test2.err | cat >archive2.tar ",__dest);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_b.c"
                      ,L'7',0,"0",(long)wVar1,
                      "systemf(\"%s -cf - file1 2>test2.err | cat >archive2.tar \", testprog_ustar)"
                      ,(void *)0x0);
  failure("bsdtar does pad archives written to pipes");
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_b.c"
                      ,L'9',"archive2.tar",0x2800);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_b.c"
             ,L':',"test2.err");
  wVar1 = systemf("%s -cf - -b 20 file1 2>test3.err | cat >archive3.tar ",__dest);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_b.c"
                      ,L'<',0,"0",(long)wVar1,
                      "systemf(\"%s -cf - -b 20 file1 2>test3.err | cat >archive3.tar \", testprog_ustar)"
                      ,(void *)0x0);
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_b.c"
                      ,L'=',"archive3.tar",0x2800);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_b.c"
             ,L'>',"test3.err");
  wVar1 = systemf("%s -cf - -b 10 file1 2>test4.err | cat >archive4.tar ",__dest);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_b.c"
                      ,L'@',0,"0",(long)wVar1,
                      "systemf(\"%s -cf - -b 10 file1 2>test4.err | cat >archive4.tar \", testprog_ustar)"
                      ,(void *)0x0);
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_b.c"
                      ,L'A',"archive4.tar",0x1400);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_b.c"
             ,L'B',"test4.err");
  wVar1 = systemf("%s -cf - -b 1 file1 2>test5.err | cat >archive5.tar ",__dest);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_b.c"
                      ,L'D',0,"0",(long)wVar1,
                      "systemf(\"%s -cf - -b 1 file1 2>test5.err | cat >archive5.tar \", testprog_ustar)"
                      ,(void *)0x0);
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_b.c"
                      ,L'E',"archive5.tar",0x800);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_b.c"
             ,L'F',"test5.err");
  wVar1 = systemf("%s -cf - -b 8192 file1 2>test6.err | cat >archive6.tar ",__dest);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_b.c"
                      ,L'H',0,"0",(long)wVar1,
                      "systemf(\"%s -cf - -b 8192 file1 2>test6.err | cat >archive6.tar \", testprog_ustar)"
                      ,(void *)0x0);
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_b.c"
                      ,L'I',"archive6.tar",0x400000);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_b.c"
             ,L'J',"test6.err");
  return;
}

Assistant:

DEFINE_TEST(test_option_b)
{
	char *testprog_ustar = malloc(strlen(testprog) + sizeof(USTAR_OPT) + 1);
	strcpy(testprog_ustar, testprog);
	strcat(testprog_ustar, USTAR_OPT);

	assertMakeFile("file1", 0644, "file1");
	if (systemf("cat file1 > test_cat.out 2> test_cat.err") != 0) {
		skipping("Platform doesn't have cat");
		return;
	}

	/*
	 * Bsdtar does not pad if the output is going directly to a disk file.
	 */
	assertEqualInt(0, systemf("%s -cf archive1.tar file1 >test1.out 2>test1.err", testprog_ustar));
	failure("bsdtar does not pad archives written directly to regular files");
	assertFileSize("archive1.tar", 2048);
	assertEmptyFile("test1.out");
	assertEmptyFile("test1.err");

	/*
	 * Bsdtar does pad to the block size if the output is going to a socket.
	 */
	/* Default is -b 20 */
	assertEqualInt(0, systemf("%s -cf - file1 2>test2.err | cat >archive2.tar ", testprog_ustar));
	failure("bsdtar does pad archives written to pipes");
	assertFileSize("archive2.tar", 10240);
	assertEmptyFile("test2.err");

	assertEqualInt(0, systemf("%s -cf - -b 20 file1 2>test3.err | cat >archive3.tar ", testprog_ustar));
	assertFileSize("archive3.tar", 10240);
	assertEmptyFile("test3.err");

	assertEqualInt(0, systemf("%s -cf - -b 10 file1 2>test4.err | cat >archive4.tar ", testprog_ustar));
	assertFileSize("archive4.tar", 5120);
	assertEmptyFile("test4.err");

	assertEqualInt(0, systemf("%s -cf - -b 1 file1 2>test5.err | cat >archive5.tar ", testprog_ustar));
	assertFileSize("archive5.tar", 2048);
	assertEmptyFile("test5.err");

	assertEqualInt(0, systemf("%s -cf - -b 8192 file1 2>test6.err | cat >archive6.tar ", testprog_ustar));
	assertFileSize("archive6.tar", 4194304);
	assertEmptyFile("test6.err");

	/*
	 * Note: It's not possible to verify at this level that blocks
	 * are getting written with the
	 */
}